

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

uint lodepng::convertFromXYZ
               (uchar *out,float *in,uint w,uint h,LodePNGState *state,float *whitepoint,
               uint rendering_intent)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float *out_00;
  uchar *in_00;
  uchar *puVar5;
  ulong uVar6;
  long lVar7;
  ushort uVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  uint local_1a8;
  LodePNGColorMode mode16;
  LodePNGICC icc;
  
  uVar2 = (state->info_raw).bitdepth;
  icc.trc[0].lut = (float *)0x0;
  icc.trc[0].lut_size = 0;
  icc.trc[1].lut = (float *)0x0;
  icc.trc[1].lut_size = 0;
  icc.trc[2].lut = (float *)0x0;
  icc.trc[2].lut_size = 0;
  uVar4 = 1;
  if ((state->info_png).iccp_defined == 0) {
    local_1a8 = 0;
  }
  else {
    uVar3 = parseICC(&icc,(state->info_png).iccp_profile,(ulong)(state->info_png).iccp_profile_size)
    ;
    if (uVar3 != 0) {
      out_00 = (float *)0x0;
      in_00 = (uchar *)0x0;
      goto LAB_0011a710;
    }
    local_1a8 = validateICC(&icc);
  }
  uVar3 = h * w;
  out_00 = (float *)malloc((ulong)(uVar3 * 4) << 2);
  uVar4 = convertFromXYZ_chrm(out_00,in,w,h,&state->info_png,local_1a8,&icc,whitepoint,
                              rendering_intent);
  if (uVar4 == 0) {
    convertFromXYZ_gamma(out_00,w,h,&state->info_png,local_1a8,&icc);
    in_00 = (uchar *)malloc((ulong)(uVar3 * 8));
    if (uVar2 < 9) {
      lodepng_color_mode_make(LCT_RGBA,8);
      puVar5 = in_00;
      pfVar9 = out_00;
      for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
        for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
          fVar1 = pfVar9[lVar7];
          fVar10 = (float)(~-(uint)(fVar1 < 0.0) & ~-(uint)(fVar1 < 1.0) & 0x3f800000);
          fVar11 = fVar1;
          if (1.0 <= fVar1) {
            fVar11 = fVar10;
          }
          if (0.0 <= fVar1) {
            fVar10 = fVar11;
          }
          puVar5[lVar7] = (uchar)(int)(fVar10 * 255.0 + 0.5);
        }
        pfVar9 = pfVar9 + 4;
        puVar5 = puVar5 + 4;
      }
    }
    else {
      lodepng_color_mode_make(LCT_RGBA,0x10);
      puVar5 = in_00 + 1;
      pfVar9 = out_00;
      for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
        for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
          fVar1 = pfVar9[lVar7];
          fVar10 = (float)(~-(uint)(fVar1 < 0.0) & ~-(uint)(fVar1 < 1.0) & 0x3f800000);
          fVar11 = fVar1;
          if (1.0 <= fVar1) {
            fVar11 = fVar10;
          }
          if (0.0 <= fVar1) {
            fVar10 = fVar11;
          }
          uVar8 = (ushort)(int)(fVar10 * 65535.0 + 0.5);
          *(ushort *)(puVar5 + lVar7 * 2 + -1) = uVar8 << 8 | uVar8 >> 8;
        }
        pfVar9 = pfVar9 + 4;
        puVar5 = puVar5 + 8;
      }
    }
    uVar4 = lodepng_convert(out,in_00,&state->info_raw,&mode16,w,h);
  }
  else {
    in_00 = (uchar *)0x0;
    uVar4 = 1;
  }
LAB_0011a710:
  lodepng_icc_cleanup(&icc);
  free(out_00);
  free(in_00);
  return uVar4;
}

Assistant:

unsigned convertFromXYZ(unsigned char* out, const float* in, unsigned w, unsigned h,
                        const LodePNGState* state,
                        const float whitepoint[3], unsigned rendering_intent) {
  unsigned error = 0;
  size_t i, c;
  size_t n = w * h;
  const LodePNGColorMode* mode_out = &state->info_raw;
  const LodePNGInfo* info = &state->info_png;
  int bit16 = mode_out->bitdepth > 8;
  float* im = 0;
  unsigned char* data = 0;

  /* parse ICC if present */
  unsigned use_icc = 0;
  LodePNGICC icc;
  lodepng_icc_init(&icc);
  if(info->iccp_defined) {
    error = parseICC(&icc, info->iccp_profile, info->iccp_profile_size);
    if(error) goto cleanup; /* corrupted ICC profile */
    use_icc = validateICC(&icc);
  }

  /* Handle gamut */
  im = (float*)lodepng_malloc(w * h * 4 * sizeof(float));
  error = convertFromXYZ_chrm(im, in, w, h, info, use_icc, &icc, whitepoint, rendering_intent);
  if(error) goto cleanup;

  /* Handle transfer function */
  /* Input is floating point, so lookup table cannot be used, but it's ensured to use float pow, not the slower double pow. */
  convertFromXYZ_gamma(im, w, h, info, use_icc, &icc);

  /* Convert to integer output */
  data = (unsigned char*)lodepng_malloc(w * h * 8);
  /* TODO: check if also 1/2/4 bit case needed: rounding is at different fine-grainedness for 8 and 16 bits below. */
  if(bit16) {
    LodePNGColorMode mode16 = lodepng_color_mode_make(LCT_RGBA, 16);
    for(i = 0; i < n; i++) {
      for(c = 0; c < 4; c++) {
        size_t j = i * 8 + c * 2;
        int i16 = (int)(0.5f + 65535.0f * LODEPNG_MIN(LODEPNG_MAX(0.0f, im[i * 4 + c]), 1.0f));
        data[j + 0] = i16 >> 8;
        data[j + 1] = i16 & 255;
      }
    }
    error = lodepng_convert(out, data, mode_out, &mode16, w, h);
    if(error) goto cleanup;
  } else {
    LodePNGColorMode mode8 = lodepng_color_mode_make(LCT_RGBA, 8);
    for(i = 0; i < n; i++) {
      for(c = 0; c < 4; c++) {
        int i8 = (int)(0.5f + 255.0f * LODEPNG_MIN(LODEPNG_MAX(0.0f, im[i * 4 + c]), 1.0f));
        data[i * 4 + c] = i8;
      }
    }
    error = lodepng_convert(out, data, mode_out, &mode8, w, h);
    if(error) goto cleanup;
  }

cleanup:
  lodepng_icc_cleanup(&icc);
  lodepng_free(im);
  lodepng_free(data);
  return error;
}